

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_schedule_async.c
# Opt level: O1

int log_policy_schedule_async_create(log_policy policy,log_policy_ctor ctor)

{
  undefined8 *instance;
  
  instance = (undefined8 *)malloc(8);
  if (instance != (undefined8 *)0x0) {
    *instance = 0;
    log_policy_instantiate(policy,instance,0);
  }
  return (uint)(instance == (undefined8 *)0x0);
}

Assistant:

static int log_policy_schedule_async_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_schedule_async_data async_data = malloc(sizeof(struct log_policy_schedule_async_data_type));

	(void)ctor;

	if (async_data == NULL)
	{
		return 1;
	}

	async_data->mutex = NULL;

	log_policy_instantiate(policy, async_data, LOG_POLICY_SCHEDULE_ASYNC);

	return 0;
}